

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_poll.cpp
# Opt level: O2

void * poll_routine(void *arg)

{
  int __fd;
  uint uVar1;
  uint uVar2;
  stCoRoutine_t *psVar3;
  uint *puVar4;
  char *pcVar5;
  pollfd *__fds;
  long lVar6;
  iterator iVar7;
  long lVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  size_t i_1;
  int *piVar11;
  pollfd *__v;
  size_t i_2;
  ulong __nfds;
  bool bVar12;
  set<int,_std::less<int>,_std::allocator<int>_> setRaiseFds;
  
  co_enable_hook_sys();
  lVar9 = 0xc;
  uVar10 = 0;
  while( true ) {
    lVar6 = *arg;
    lVar8 = *(long *)((long)arg + 8) - lVar6;
    __nfds = lVar8 >> 5;
    if (__nfds <= uVar10) break;
    __fd = socket(2,1,6);
    uVar1 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    lVar6 = *arg;
    *(int *)(lVar6 + -4 + lVar9) = __fd;
    uVar2 = connect(__fd,(sockaddr *)(lVar6 + lVar9),0x10);
    psVar3 = co_self();
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    pcVar5 = strerror(uVar1);
    printf("co %p connect i %ld ret %d errno %d (%s)\n",psVar3,uVar10,(ulong)uVar2,(ulong)uVar1,
           pcVar5);
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x20;
  }
  __fds = (pollfd *)calloc(1,lVar8 >> 2);
  piVar11 = (int *)(lVar6 + 8);
  for (uVar10 = 0; __nfds != uVar10; uVar10 = uVar10 + 1) {
    __fds[uVar10].fd = *piVar11;
    __fds[uVar10].events = 0x1c;
    piVar11 = piVar11 + 8;
  }
  setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_header;
  setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar1 = poll(__fds,__nfds,1000);
    psVar3 = co_self();
    printf("co %p poll wait %ld ret %d\n",psVar3,__nfds,(ulong)uVar1);
    uVar10 = __nfds & 0xffffffff;
    __v = __fds;
    if ((int)__nfds < 1) {
      uVar10 = 0;
    }
    while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
      psVar3 = co_self();
      printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",psVar3,
             (ulong)(uint)__v->fd,(ulong)(uint)(int)__v->revents,4,8,0x10);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &setRaiseFds,&__v->fd);
      __v = __v + 1;
    }
    lVar9 = *arg;
    lVar6 = *(long *)((long)arg + 8);
    bVar12 = setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count != lVar6 - lVar9 >> 5;
    if (0 >= (int)uVar1 || !bVar12) break;
    lVar8 = 8;
    __nfds = 0;
    for (uVar10 = 0; uVar10 < (ulong)(lVar6 - lVar9 >> 5); uVar10 = uVar10 + 1) {
      iVar7 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &setRaiseFds,(key_type *)(lVar9 + lVar8));
      lVar9 = *arg;
      if ((_Rb_tree_header *)iVar7._M_node == &setRaiseFds._M_t._M_impl.super__Rb_tree_header) {
        __fds[__nfds].fd = *(int *)(lVar9 + lVar8);
        __fds[__nfds].events = 0x1c;
        __nfds = __nfds + 1;
      }
      lVar6 = *(long *)((long)arg + 8);
      lVar8 = lVar8 + 0x20;
    }
  } while (0 < (int)uVar1 && bVar12);
  lVar8 = 8;
  for (uVar10 = 0; uVar10 < (ulong)(lVar6 - lVar9 >> 5); uVar10 = uVar10 + 1) {
    close(*(int *)(lVar9 + lVar8));
    lVar9 = *arg;
    *(undefined4 *)(lVar9 + lVar8) = 0xffffffff;
    lVar6 = *(long *)((long)arg + 8);
    lVar8 = lVar8 + 0x20;
  }
  psVar3 = co_self();
  printf("co %p task cnt %ld fire %ld\n",psVar3,*(long *)((long)arg + 8) - *arg >> 5,
         setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&setRaiseFds._M_t);
  return (void *)0x0;
}

Assistant:

static void *poll_routine( void *arg )
{
	co_enable_hook_sys();

	vector<task_t> &v = *(vector<task_t>*)arg;
	for(size_t i=0;i<v.size();i++)
	{
		int fd = CreateTcpSocket();
		SetNonBlock( fd );
		v[i].fd = fd;

		int ret = connect(fd,(struct sockaddr*)&v[i].addr,sizeof( v[i].addr )); 
		printf("co %p connect i %ld ret %d errno %d (%s)\n",
			co_self(),i,ret,errno,strerror(errno));
	}
	struct pollfd *pf = (struct pollfd*)calloc( 1,sizeof(struct pollfd) * v.size() );

	for(size_t i=0;i<v.size();i++)
	{
		pf[i].fd = v[i].fd;
		pf[i].events = ( POLLOUT | POLLERR | POLLHUP );
	}
	set<int> setRaiseFds;
	size_t iWaitCnt = v.size();
	for(;;)
	{
		int ret = poll( pf,iWaitCnt,1000 );
		printf("co %p poll wait %ld ret %d\n",
				co_self(),iWaitCnt,ret);
		for(int i=0;i<(int)iWaitCnt;i++)
		{
			printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",
					co_self(),
					pf[i].fd,
					pf[i].revents,
					POLLOUT,
					POLLERR,
					POLLHUP
					);
			setRaiseFds.insert( pf[i].fd );
		}
		if( setRaiseFds.size() == v.size())
		{
			break;
		}
		if( ret <= 0 )
		{
			break;
		}

		iWaitCnt = 0;
		for(size_t i=0;i<v.size();i++)
		{
			if( setRaiseFds.find( v[i].fd ) == setRaiseFds.end() )
			{
				pf[ iWaitCnt ].fd = v[i].fd;
				pf[ iWaitCnt ].events = ( POLLOUT | POLLERR | POLLHUP );
				++iWaitCnt;
			}
		}
	}
	for(size_t i=0;i<v.size();i++)
	{
		close( v[i].fd );
		v[i].fd = -1;
	}

	printf("co %p task cnt %ld fire %ld\n",
			co_self(),v.size(),setRaiseFds.size() );
	return 0;
}